

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cpp
# Opt level: O3

void writeBank(SortedSection *bankSections,uint16_t baseOffset,uint16_t size)

{
  Section *pSVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  short sVar5;
  ushort uVar6;
  
  if (bankSections == (SortedSection *)0x0) {
    uVar3 = 0;
  }
  else {
    uVar3 = 0;
    do {
      pSVar1 = bankSections->section;
      if (pSVar1->offset != 0) {
        __assert_fail("section->offset == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/link/output.cpp"
                      ,0xcb,"writeBank");
      }
      for (; (uint)uVar3 + (uint)baseOffset < (uint)pSVar1->org; uVar3 = uVar3 + 1) {
        if (overlayFile == (FILE *)0x0) {
          uVar4 = (uint)padValue;
        }
        else {
          uVar4 = getc((FILE *)overlayFile);
        }
        putc(uVar4,(FILE *)outputFile);
      }
      fwrite(pSVar1->data,1,(ulong)pSVar1->size,(FILE *)outputFile);
      uVar2 = pSVar1->size;
      if (overlayFile != (FILE *)0x0) {
        if (uVar2 == 0) {
          uVar2 = 0;
        }
        else {
          uVar6 = 0;
          do {
            getc((FILE *)overlayFile);
            uVar6 = uVar6 + 1;
            uVar2 = pSVar1->size;
          } while (uVar6 < uVar2);
        }
      }
      uVar3 = uVar2 + uVar3;
      bankSections = bankSections->next;
    } while (bankSections != (SortedSection *)0x0);
  }
  if ((disablePadding == false) && (uVar3 < size)) {
    sVar5 = size - uVar3;
    do {
      if (overlayFile == (FILE *)0x0) {
        uVar4 = (uint)padValue;
      }
      else {
        uVar4 = getc((FILE *)overlayFile);
      }
      putc(uVar4,(FILE *)outputFile);
      sVar5 = sVar5 + -1;
    } while (sVar5 != 0);
  }
  return;
}

Assistant:

static void writeBank(struct SortedSection *bankSections, uint16_t baseOffset,
		      uint16_t size)
{
	uint16_t offset = 0;

	while (bankSections) {
		struct Section const *section = bankSections->section;

		assert(section->offset == 0);
		// Output padding up to the next SECTION
		while (offset + baseOffset < section->org) {
			putc(overlayFile ? getc(overlayFile) : padValue, outputFile);
			offset++;
		}

		// Output the section itself
		fwrite(section->data, sizeof(*section->data), section->size,
		       outputFile);
		if (overlayFile) {
			// Skip bytes even with pipes
			for (uint16_t i = 0; i < section->size; i++)
				getc(overlayFile);
		}
		offset += section->size;

		bankSections = bankSections->next;
	}

	if (!disablePadding) {
		while (offset < size) {
			putc(overlayFile ? getc(overlayFile) : padValue, outputFile);
			offset++;
		}
	}
}